

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim,bool advance)

{
  uint uVar1;
  uint uVar2;
  int pos;
  size_type sVar3;
  LexChar LVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  SQUnsignedInteger size;
  SQInteger SVar10;
  SQChar temp [9];
  SQChar *stemp;
  undefined1 local_48 [16];
  char *local_38;
  
  if ((ndelim == 0x22) || (this->_state != LS_TEMPALTE)) {
    local_48[0] = '\0';
    sqvector<char,_unsigned_int>::resize(&this->_longstr,0,local_48);
    if (advance) {
      uVar6 = this->_sourceTextPtr;
      if (uVar6 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar6 + 1;
        LVar4 = this->_sourceText[uVar6];
      }
      else {
        this->_reached_eof = 1;
        LVar4 = '\0';
      }
      this->_currdata = LVar4;
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    if (this->_currdata == '\0') {
      return -1;
    }
    SVar10 = 0x103;
    do {
      while (bVar8 = this->_currdata, (ulong)bVar8 == ndelim) {
        uVar6 = this->_sourceTextPtr;
        if (uVar6 < this->_sourceTextSize) {
          this->_sourceTextPtr = uVar6 + 1;
          LVar4 = this->_sourceText[uVar6];
        }
        else {
          this->_reached_eof = 1;
          LVar4 = '\0';
        }
        this->_currdata = LVar4;
        this->_currentcolumn = this->_currentcolumn + 1;
        if (this->_state == LS_TEMPALTE) {
          SVar10 = 0x153;
        }
        if ((!verbatim) || (LVar4 != '\"')) goto LAB_001383de;
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\"';
        uVar6 = this->_sourceTextPtr;
        if (uVar6 < this->_sourceTextSize) {
          this->_sourceTextPtr = uVar6 + 1;
          LVar4 = this->_sourceText[uVar6];
        }
        else {
          this->_reached_eof = 1;
          LVar4 = '\0';
        }
        this->_currdata = LVar4;
        this->_currentcolumn = this->_currentcolumn + 1;
      }
      if (bVar8 < 0x5c) {
        if (bVar8 == 0) {
          iVar9 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_UNFINISHED_STRING,(int32_t)this->_tokenline,iVar9,
                     (int)this->_currentcolumn - iVar9);
          iVar9 = 1;
        }
        else {
          if (bVar8 != 10) goto LAB_00137c33;
          if (!verbatim) {
            iVar9 = (int)this->_tokencolumn;
            SQCompilation::SQCompilationContext::reportDiagnostic
                      (this->_ctx,DI_NEWLINE_IN_CONST,(int32_t)this->_tokenline,iVar9,
                       (int)this->_currentcolumn - iVar9);
          }
          LVar4 = this->_currdata;
          uVar1 = (this->_longstr)._allocated;
          uVar2 = (this->_longstr)._size;
          if (uVar1 <= uVar2) {
            uVar2 = uVar2 * 2;
            if (uVar2 == 0) {
              uVar2 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar1,(ulong)uVar2);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = uVar2;
          }
          uVar1 = (this->_longstr)._size;
          (this->_longstr)._size = uVar1 + 1;
          (this->_longstr)._vals[uVar1] = LVar4;
          uVar6 = this->_sourceTextPtr;
          if (uVar6 < this->_sourceTextSize) {
            this->_sourceTextPtr = uVar6 + 1;
            LVar4 = this->_sourceText[uVar6];
          }
          else {
            this->_reached_eof = 1;
            LVar4 = '\0';
          }
          this->_currdata = LVar4;
          this->_currentcolumn = this->_currentcolumn + 1;
          this->_currentline = this->_currentline + 1;
          iVar9 = 0;
          if (this->_comments != (Comments *)0x0) {
            SQCompilation::Comments::pushNewLine(this->_comments);
          }
        }
        goto LAB_00137dc3;
      }
      if (bVar8 != 0x5c) {
        if ((bVar8 != 0x7b) || (this->_state != LS_TEMPALTE)) {
LAB_00137c33:
          uVar1 = (this->_longstr)._size;
          uVar2 = (this->_longstr)._allocated;
          if (uVar2 <= uVar1) {
            uVar1 = uVar1 * 2;
            if (uVar1 == 0) {
              uVar1 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar2,(ulong)uVar1);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = uVar1;
          }
          uVar1 = (this->_longstr)._size;
          (this->_longstr)._size = uVar1 + 1;
          (this->_longstr)._vals[uVar1] = bVar8;
          goto LAB_00137d27;
        }
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '{';
        uVar6 = this->_sourceTextPtr;
        if (uVar6 < this->_sourceTextSize) {
          this->_sourceTextPtr = uVar6 + 1;
          LVar4 = this->_sourceText[uVar6];
        }
        else {
          this->_reached_eof = 1;
          LVar4 = '\0';
        }
        this->_currdata = LVar4;
        this->_currentcolumn = this->_currentcolumn + 1;
        SVar10 = this->_expectedToken;
        iVar9 = 8;
        goto LAB_00137dc3;
      }
      if (verbatim) {
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
LAB_00137d0d:
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\\';
        goto LAB_00137d27;
      }
      uVar6 = this->_sourceTextPtr;
      if (uVar6 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar6 + 1;
        bVar8 = this->_sourceText[uVar6];
      }
      else {
        this->_reached_eof = 1;
        bVar8 = 0;
      }
      this->_currdata = bVar8;
      lVar7 = this->_currentcolumn + 1;
      this->_currentcolumn = lVar7;
      if (bVar8 < 0x62) {
        if (bVar8 < 0x55) {
          if (bVar8 == 0x22) {
            uVar1 = (this->_longstr)._size;
            uVar2 = (this->_longstr)._allocated;
            if (uVar2 <= uVar1) {
              uVar1 = uVar1 * 2;
              if (uVar1 == 0) {
                uVar1 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                             (ulong)uVar2,(ulong)uVar1);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = uVar1;
            }
            uVar1 = (this->_longstr)._size;
            (this->_longstr)._size = uVar1 + 1;
            (this->_longstr)._vals[uVar1] = '\"';
          }
          else if (bVar8 == 0x27) {
            uVar1 = (this->_longstr)._size;
            uVar2 = (this->_longstr)._allocated;
            if (uVar2 <= uVar1) {
              uVar1 = uVar1 * 2;
              if (uVar1 == 0) {
                uVar1 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                             (ulong)uVar2,(ulong)uVar1);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = uVar1;
            }
            uVar1 = (this->_longstr)._size;
            (this->_longstr)._size = uVar1 + 1;
            (this->_longstr)._vals[uVar1] = '\'';
          }
          else {
            if (bVar8 != 0x30) goto switchD_00137e9a_caseD_6f;
            uVar1 = (this->_longstr)._size;
            uVar2 = (this->_longstr)._allocated;
            if (uVar2 <= uVar1) {
              uVar1 = uVar1 * 2;
              if (uVar1 == 0) {
                uVar1 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                             (ulong)uVar2,(ulong)uVar1);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = uVar1;
            }
            uVar1 = (this->_longstr)._size;
            (this->_longstr)._size = uVar1 + 1;
            (this->_longstr)._vals[uVar1] = '\0';
          }
        }
        else {
          if (bVar8 == 0x55) goto switchD_00137e9a_caseD_75;
          if (bVar8 == 0x5c) {
            uVar1 = (this->_longstr)._size;
            uVar2 = (this->_longstr)._allocated;
            if (uVar2 <= uVar1) {
              uVar1 = uVar1 * 2;
              if (uVar1 == 0) {
                uVar1 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                             (ulong)uVar2,(ulong)uVar1);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = uVar1;
            }
            goto LAB_00137d0d;
          }
          if (bVar8 != 0x61) goto switchD_00137e9a_caseD_6f;
          uVar1 = (this->_longstr)._size;
          uVar2 = (this->_longstr)._allocated;
          if (uVar2 <= uVar1) {
            uVar1 = uVar1 * 2;
            if (uVar1 == 0) {
              uVar1 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar2,(ulong)uVar1);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = uVar1;
          }
          uVar1 = (this->_longstr)._size;
          (this->_longstr)._size = uVar1 + 1;
          (this->_longstr)._vals[uVar1] = '\a';
        }
        goto LAB_00137d27;
      }
      switch(bVar8) {
      case 0x6e:
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\n';
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
      case 0x7a:
      case 0x7c:
switchD_00137e9a_caseD_6f:
        pos = (int)this->_tokencolumn;
        iVar9 = 0;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_UNRECOGNISED_ESCAPER,(int32_t)this->_tokenline,pos,(int)lVar7 - pos
                  );
        goto LAB_00137dc3;
      case 0x72:
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\r';
        break;
      case 0x74:
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\t';
        break;
      case 0x75:
switchD_00137e9a_caseD_75:
        ProcessStringHexEscape(this,local_48,(ulong)(bVar8 != 0x75) * 4 + 4);
        uVar6 = strtoul(local_48,&local_38,0x10);
        AddUTF8(this,uVar6);
        goto LAB_00137d56;
      case 0x76:
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = '\v';
        break;
      case 0x78:
        ProcessStringHexEscape(this,(SQChar *)&local_38,2);
        uVar6 = strtoul((char *)&local_38,(char **)local_48,0x10);
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = (char)uVar6;
        goto LAB_00137d56;
      case 0x7b:
      case 0x7d:
        if (this->_state != LS_TEMPALTE) goto switchD_00137e9a_caseD_6f;
        uVar1 = (this->_longstr)._size;
        uVar2 = (this->_longstr)._allocated;
        if (uVar2 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar2,(ulong)uVar1);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = uVar1;
        }
        uVar1 = (this->_longstr)._size;
        (this->_longstr)._size = uVar1 + 1;
        (this->_longstr)._vals[uVar1] = bVar8;
        break;
      default:
        if (bVar8 == 0x62) {
          uVar1 = (this->_longstr)._size;
          uVar2 = (this->_longstr)._allocated;
          if (uVar2 <= uVar1) {
            uVar1 = uVar1 * 2;
            if (uVar1 == 0) {
              uVar1 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar2,(ulong)uVar1);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = uVar1;
          }
          uVar1 = (this->_longstr)._size;
          (this->_longstr)._size = uVar1 + 1;
          (this->_longstr)._vals[uVar1] = '\b';
        }
        else {
          if (bVar8 != 0x66) goto switchD_00137e9a_caseD_6f;
          uVar1 = (this->_longstr)._size;
          uVar2 = (this->_longstr)._allocated;
          if (uVar2 <= uVar1) {
            uVar1 = uVar1 * 2;
            if (uVar1 == 0) {
              uVar1 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar2,(ulong)uVar1);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = uVar1;
          }
          uVar1 = (this->_longstr)._size;
          (this->_longstr)._size = uVar1 + 1;
          (this->_longstr)._vals[uVar1] = '\f';
        }
      }
LAB_00137d27:
      uVar6 = this->_sourceTextPtr;
      if (uVar6 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar6 + 1;
        LVar4 = this->_sourceText[uVar6];
      }
      else {
        this->_reached_eof = 1;
        LVar4 = '\0';
      }
      this->_currdata = LVar4;
      this->_currentcolumn = this->_currentcolumn + 1;
LAB_00137d56:
      iVar9 = 0;
LAB_00137dc3:
    } while (iVar9 == 0);
    if (iVar9 == 8) {
LAB_001383de:
      uVar1 = (this->_longstr)._size;
      uVar2 = (this->_longstr)._allocated;
      if (uVar2 <= uVar1) {
        uVar1 = uVar1 * 2;
        size = 4;
        if (uVar1 != 0) {
          size = (SQUnsignedInteger)uVar1;
        }
        pcVar5 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                       (ulong)uVar2,size);
        (this->_longstr)._vals = pcVar5;
        (this->_longstr)._allocated = (size_type)size;
      }
      uVar1 = (this->_longstr)._size;
      (this->_longstr)._size = uVar1 + 1;
      (this->_longstr)._vals[uVar1] = '\0';
      if (ndelim == 0x27) {
        sVar3 = (this->_longstr)._size;
        if (sVar3 == 1) {
          iVar9 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_EMPTY_LITERAL,(int32_t)this->_tokenline,iVar9,
                     (int)this->_currentcolumn - iVar9);
        }
        if (1 < sVar3 - 1) {
          iVar9 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_TOO_LONG_LITERAL,(int32_t)this->_tokenline,iVar9,
                     (int)this->_currentcolumn - iVar9);
        }
        this->_nvalue = (long)*(this->_longstr)._vals;
        return 0x104;
      }
      this->_svalue = (this->_longstr)._vals;
      return SVar10;
    }
  }
  else {
    iVar9 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_EXPECTED_LEX,(int32_t)this->_tokenline,iVar9,
               (int)this->_currentcolumn - iVar9,"string");
  }
  return -1;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim, bool advance)
{
    SQInteger t = TK_STRING_LITERAL;
    if (_state == LS_TEMPALTE && ndelim != _SC('\"')) {
        _ctx.reportDiagnostic(DiagnosticsId::DI_EXPECTED_LEX, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "string");
        return -1;
    }
    INIT_TEMP_STRING();
    if (advance)
      NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                _ctx.reportDiagnostic(DiagnosticsId::DI_UNFINISHED_STRING, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                return -1;
            case _SC('\n'):
                if(!verbatim)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_NEWLINE_IN_CONST, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                APPEND_CHAR(CUR_CHAR); NEXT();
                nextLine();
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        AddUTF8(strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    case _SC('{'): case _SC('}'):
                        if (_state == LS_TEMPALTE) {
                          APPEND_CHAR(CUR_CHAR);
                          NEXT();
                          break;
                        }
                    // fall through -V796
                    default:
                        _ctx.reportDiagnostic(DiagnosticsId::DI_UNRECOGNISED_ESCAPER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                    }
                }
                break;
            case _SC('{'):
                if (_state == LS_TEMPALTE) {
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                    assert(_expectedToken > 0);
                    t = _expectedToken;
                    goto loop_exit;
                }
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();

        if (_state == LS_TEMPALTE)
          t = TK_TEMPLATE_SUFFIX;

        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }

loop_exit:
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        assert(_state != LS_TEMPALTE);
        if(len == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_EMPTY_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(len > 1)
            _ctx.reportDiagnostic(DiagnosticsId::DI_TOO_LONG_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    SetStringValue();
    return t;
}